

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3FkCheck(Parse *pParse,Table *pTab,int regOld,int regNew,int *aChange,int bChngRowid)

{
  u8 uVar1;
  u8 uVar2;
  int iVar3;
  char *zRight;
  Trigger *pTVar4;
  Index *pIVar5;
  int iVar6;
  byte bVar7;
  int iVar8;
  Table *pTVar9;
  Vdbe *p;
  i16 *piVar10;
  HashElem *pHVar11;
  SrcList *pSrc;
  Parse *pPVar12;
  undefined4 in_register_0000000c;
  int *piVar13;
  undefined4 in_register_00000014;
  Schema **ppSVar14;
  long lVar15;
  FKey *pFVar16;
  uint uVar17;
  ulong uVar18;
  sColMap *psVar19;
  char *zDbase;
  sqlite3 *psVar20;
  long lVar21;
  bool bVar22;
  Index *pIdx;
  int *aiFree;
  sqlite3 *local_80;
  int *local_78;
  int local_6c;
  undefined8 local_68;
  int local_60;
  int iCol;
  char *local_58;
  int *local_50;
  undefined8 local_48;
  ulong local_40;
  i16 *local_38;
  
  local_68 = CONCAT44(in_register_00000014,regOld);
  local_48 = CONCAT44(in_register_0000000c,regNew);
  psVar20 = pParse->db;
  if ((psVar20->flags & 0x80000) != 0) {
    if (pTab->pSchema == (Schema *)0x0) {
      uVar18 = 0xfff0bdc0;
    }
    else {
      uVar17 = psVar20->nDb;
      if ((int)uVar17 < 1) {
        uVar18 = 0;
      }
      else {
        ppSVar14 = &psVar20->aDb->pSchema;
        uVar18 = 0;
        do {
          if (*ppSVar14 == pTab->pSchema) goto LAB_0016f5fe;
          uVar18 = uVar18 + 1;
          ppSVar14 = ppSVar14 + 4;
        } while (uVar17 != uVar18);
        uVar18 = (ulong)uVar17;
      }
    }
LAB_0016f5fe:
    uVar1 = pParse->disableTriggers;
    pFVar16 = pTab->pFKey;
    local_80 = psVar20;
    local_6c = bChngRowid;
    if (pFVar16 != (FKey *)0x0) {
      zDbase = psVar20->aDb[(int)uVar18].zDbSName;
      local_60 = regOld + 1;
      local_58 = zDbase;
      local_50 = aChange;
      local_40 = uVar18;
      do {
        pIdx = (Index *)0x0;
        aiFree = (int *)0x0;
        if (aChange == (int *)0x0) {
LAB_0016f6d4:
          if (pParse->disableTriggers == '\0') {
            pTVar9 = sqlite3LocateTable(pParse,0,pFVar16->zTo,zDbase);
          }
          else {
            pTVar9 = sqlite3FindTable(psVar20,pFVar16->zTo,zDbase);
          }
          if ((pTVar9 == (Table *)0x0) ||
             (iVar8 = sqlite3FkLocateIndex(pParse,pTVar9,pFVar16,&pIdx,&aiFree), pIVar5 = pIdx,
             iVar8 != 0)) {
            psVar20 = local_80;
            if (uVar1 == '\0') {
              bVar7 = 1;
            }
            else {
              bVar22 = local_80->mallocFailed == '\0';
              if (bVar22 && pTVar9 == (Table *)0x0) {
                p = pParse->pVdbe;
                if (p == (Vdbe *)0x0) {
                  p = allocVdbe(pParse);
                }
                iVar6 = local_60;
                iVar8 = pFVar16->nCol;
                if (0 < iVar8) {
                  iVar3 = p->nOp;
                  psVar19 = pFVar16->aCol;
                  lVar15 = 0;
                  do {
                    sqlite3VdbeAddOp3(p,0x22,psVar19->iFrom + iVar6,iVar3 + iVar8 + 1,0);
                    lVar15 = lVar15 + 1;
                    psVar19 = psVar19 + 1;
                  } while (lVar15 < pFVar16->nCol);
                }
                sqlite3VdbeAddOp3(p,0x8f,(uint)pFVar16->isDeferred,-1,0);
                aChange = local_50;
                psVar20 = local_80;
                goto LAB_0016f979;
              }
              bVar7 = bVar22 * '\x03' + 1;
            }
          }
          else {
            piVar13 = aiFree;
            if (aiFree == (int *)0x0) {
              iCol = pFVar16->aCol[0].iFrom;
              piVar13 = &iCol;
            }
            local_78 = piVar13;
            if (pFVar16->nCol < 1) {
              uVar17 = 0;
            }
            else {
              local_38 = &pTVar9->iPKey;
              lVar15 = 0;
              lVar21 = 0;
              uVar17 = 0;
              do {
                if (*(int *)((long)piVar13 + lVar15 * 2) == (int)pTab->iPKey) {
                  *(undefined4 *)((long)piVar13 + lVar15 * 2) = 0xffffffff;
                }
                if (local_80->xAuth != (sqlite3_xauth)0x0) {
                  piVar10 = local_38;
                  if (pIVar5 != (Index *)0x0) {
                    piVar10 = (i16 *)((long)pIVar5->aiColumn + lVar15);
                  }
                  iVar8 = sqlite3AuthReadCol(pParse,pTVar9->zName,pTVar9->aCol[*piVar10].zName,
                                             (int)local_40);
                  uVar17 = (uint)(iVar8 == 2);
                  piVar13 = local_78;
                }
                lVar21 = lVar21 + 1;
                lVar15 = lVar15 + 2;
              } while (lVar21 < pFVar16->nCol);
            }
            iVar8 = (int)local_40;
            sqlite3TableLock(pParse,iVar8,pTVar9->tnum,'\0',pTVar9->zName);
            pParse->nTab = pParse->nTab + 1;
            if ((int)local_68 != 0) {
              fkLookupParent(pParse,iVar8,pTVar9,pIdx,pFVar16,local_78,(int)local_68,-1,uVar17);
            }
            aChange = local_50;
            if ((int)local_48 != 0) {
              pPVar12 = pParse->pToplevel;
              if (pParse->pToplevel == (Parse *)0x0) {
                pPVar12 = pParse;
              }
              if ((pPVar12->pTriggerPrg == (TriggerPrg *)0x0) ||
                 (((pTVar4 = pPVar12->pTriggerPrg->pTrigger, pTVar4 != pFVar16->apTrigger[0] ||
                   (pFVar16->aAction[0] != '\a')) &&
                  ((pTVar4 != pFVar16->apTrigger[1] || (pFVar16->aAction[1] != '\a')))))) {
                fkLookupParent(pParse,iVar8,pTVar9,pIdx,pFVar16,local_78,(int)local_48,1,uVar17);
              }
            }
            psVar20 = local_80;
            sqlite3DbFree(local_80,aiFree);
LAB_0016f979:
            bVar7 = 0;
            zDbase = local_58;
          }
        }
        else {
          zRight = pFVar16->zTo;
          if (pTab->zName == (char *)0x0) {
            iVar8 = -(uint)(zRight != (char *)0x0);
          }
          else if (zRight == (char *)0x0) {
            iVar8 = 1;
          }
          else {
            iVar8 = sqlite3StrICmp(pTab->zName,zRight);
          }
          if (iVar8 == 0) goto LAB_0016f6d4;
          bVar7 = 0;
          if (0 < (long)pFVar16->nCol) {
            lVar15 = 0;
            do {
              iVar8 = *(int *)((long)&pFVar16->aCol[0].iFrom + lVar15);
              if ((-1 < aChange[iVar8]) || ((local_6c != 0 && (iVar8 == pTab->iPKey))))
              goto LAB_0016f6d4;
              lVar15 = lVar15 + 0x10;
            } while ((long)pFVar16->nCol * 0x10 != lVar15);
          }
        }
        if ((bVar7 & 3) != 0) {
          return;
        }
        pFVar16 = pFVar16->pNextFrom;
      } while (pFVar16 != (FKey *)0x0);
    }
    pHVar11 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)&pIdx);
    if (pHVar11 == (HashElem *)0x0) {
      pFVar16 = (FKey *)0x0;
    }
    else {
      pFVar16 = (FKey *)pHVar11->data;
    }
    if (pFVar16 != (FKey *)0x0) {
      local_78 = (int *)(ulong)(aChange != (int *)0x0);
      do {
        pIdx = (Index *)0x0;
        aiFree = (int *)0x0;
        if (((aChange == (int *)0x0) ||
            (iVar8 = fkParentIsModified(pTab,pFVar16,aChange,local_6c), iVar8 != 0)) &&
           ((pFVar16->isDeferred != '\0' ||
            ((((psVar20->flags & 0x2000000) != 0 || (pParse->pToplevel != (Parse *)0x0)) ||
             (pParse->isMultiWrite != '\0')))))) {
          iVar8 = sqlite3FkLocateIndex(pParse,pTab,pFVar16,&pIdx,&aiFree);
          if (iVar8 == 0) {
            pSrc = sqlite3SrcListAppend(psVar20,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
            if (pSrc != (SrcList *)0x0) {
              pTVar9 = pFVar16->pFrom;
              pSrc->a[0].pTab = pTVar9;
              pSrc->a[0].zName = pTVar9->zName;
              pTVar9->nTabRef = pTVar9->nTabRef + 1;
              iVar8 = pParse->nTab;
              pParse->nTab = iVar8 + 1;
              pSrc->a[0].iCursor = iVar8;
              if ((int)local_48 != 0) {
                fkScanChildren(pParse,pSrc,pTab,pIdx,pFVar16,aiFree,(int)local_48,-1);
              }
              if ((int)local_68 != 0) {
                uVar2 = pFVar16->aAction[(long)local_78];
                fkScanChildren(pParse,pSrc,pTab,pIdx,pFVar16,aiFree,(int)local_68,1);
                if (((pFVar16->isDeferred == '\0') && (uVar2 != '\a')) && (uVar2 != '\t')) {
                  pPVar12 = pParse->pToplevel;
                  if (pParse->pToplevel == (Parse *)0x0) {
                    pPVar12 = pParse;
                  }
                  pPVar12->mayAbort = '\x01';
                }
              }
              psVar20 = local_80;
              pSrc->a[0].zName = (char *)0x0;
              sqlite3SrcListDelete(local_80,pSrc);
            }
            sqlite3DbFree(psVar20,aiFree);
            iVar8 = 0;
          }
          else if (uVar1 == '\0') {
            iVar8 = 1;
          }
          else {
            iVar8 = 1;
            if (psVar20->mallocFailed == '\0') {
              iVar8 = 0xd;
            }
          }
        }
        else {
          iVar8 = 0xd;
        }
      } while (((iVar8 == 0xd) || (iVar8 == 0)) &&
              (pFVar16 = pFVar16->pNextTo, pFVar16 != (FKey *)0x0));
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkCheck(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Row is being deleted from this table */ 
  int regOld,                     /* Previous row data is stored here */
  int regNew,                     /* New row data is stored here */
  int *aChange,                   /* Array indicating UPDATEd columns (or 0) */
  int bChngRowid                  /* True if rowid is UPDATEd */
){
  sqlite3 *db = pParse->db;       /* Database handle */
  FKey *pFKey;                    /* Used to iterate through FKs */
  int iDb;                        /* Index of database containing pTab */
  const char *zDb;                /* Name of database containing pTab */
  int isIgnoreErrors = pParse->disableTriggers;

  /* Exactly one of regOld and regNew should be non-zero. */
  assert( (regOld==0)!=(regNew==0) );

  /* If foreign-keys are disabled, this function is a no-op. */
  if( (db->flags&SQLITE_ForeignKeys)==0 ) return;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  zDb = db->aDb[iDb].zDbSName;

  /* Loop through all the foreign key constraints for which pTab is the
  ** child table (the table that the foreign key definition is part of).  */
  for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
    Table *pTo;                   /* Parent table of foreign key pFKey */
    Index *pIdx = 0;              /* Index on key columns in pTo */
    int *aiFree = 0;
    int *aiCol;
    int iCol;
    int i;
    int bIgnore = 0;

    if( aChange 
     && sqlite3_stricmp(pTab->zName, pFKey->zTo)!=0
     && fkChildIsModified(pTab, pFKey, aChange, bChngRowid)==0 
    ){
      continue;
    }

    /* Find the parent table of this foreign key. Also find a unique index 
    ** on the parent key columns in the parent table. If either of these 
    ** schema items cannot be located, set an error in pParse and return 
    ** early.  */
    if( pParse->disableTriggers ){
      pTo = sqlite3FindTable(db, pFKey->zTo, zDb);
    }else{
      pTo = sqlite3LocateTable(pParse, 0, pFKey->zTo, zDb);
    }
    if( !pTo || sqlite3FkLocateIndex(pParse, pTo, pFKey, &pIdx, &aiFree) ){
      assert( isIgnoreErrors==0 || (regOld!=0 && regNew==0) );
      if( !isIgnoreErrors || db->mallocFailed ) return;
      if( pTo==0 ){
        /* If isIgnoreErrors is true, then a table is being dropped. In this
        ** case SQLite runs a "DELETE FROM xxx" on the table being dropped
        ** before actually dropping it in order to check FK constraints.
        ** If the parent table of an FK constraint on the current table is
        ** missing, behave as if it is empty. i.e. decrement the relevant
        ** FK counter for each row of the current table with non-NULL keys.
        */
        Vdbe *v = sqlite3GetVdbe(pParse);
        int iJump = sqlite3VdbeCurrentAddr(v) + pFKey->nCol + 1;
        for(i=0; i<pFKey->nCol; i++){
          int iReg = pFKey->aCol[i].iFrom + regOld + 1;
          sqlite3VdbeAddOp2(v, OP_IsNull, iReg, iJump); VdbeCoverage(v);
        }
        sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, -1);
      }
      continue;
    }
    assert( pFKey->nCol==1 || (aiFree && pIdx) );

    if( aiFree ){
      aiCol = aiFree;
    }else{
      iCol = pFKey->aCol[0].iFrom;
      aiCol = &iCol;
    }
    for(i=0; i<pFKey->nCol; i++){
      if( aiCol[i]==pTab->iPKey ){
        aiCol[i] = -1;
      }
      assert( pIdx==0 || pIdx->aiColumn[i]>=0 );
#ifndef SQLITE_OMIT_AUTHORIZATION
      /* Request permission to read the parent key columns. If the 
      ** authorization callback returns SQLITE_IGNORE, behave as if any
      ** values read from the parent table are NULL. */
      if( db->xAuth ){
        int rcauth;
        char *zCol = pTo->aCol[pIdx ? pIdx->aiColumn[i] : pTo->iPKey].zName;
        rcauth = sqlite3AuthReadCol(pParse, pTo->zName, zCol, iDb);
        bIgnore = (rcauth==SQLITE_IGNORE);
      }
#endif
    }

    /* Take a shared-cache advisory read-lock on the parent table. Allocate 
    ** a cursor to use to search the unique index on the parent key columns 
    ** in the parent table.  */
    sqlite3TableLock(pParse, iDb, pTo->tnum, 0, pTo->zName);
    pParse->nTab++;

    if( regOld!=0 ){
      /* A row is being removed from the child table. Search for the parent.
      ** If the parent does not exist, removing the child row resolves an 
      ** outstanding foreign key constraint violation. */
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regOld, -1, bIgnore);
    }
    if( regNew!=0 && !isSetNullAction(pParse, pFKey) ){
      /* A row is being added to the child table. If a parent row cannot
      ** be found, adding the child row has violated the FK constraint. 
      **
      ** If this operation is being performed as part of a trigger program
      ** that is actually a "SET NULL" action belonging to this very 
      ** foreign key, then omit this scan altogether. As all child key
      ** values are guaranteed to be NULL, it is not possible for adding
      ** this row to cause an FK violation.  */
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regNew, +1, bIgnore);
    }

    sqlite3DbFree(db, aiFree);
  }

  /* Loop through all the foreign key constraints that refer to this table.
  ** (the "child" constraints) */
  for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
    Index *pIdx = 0;              /* Foreign key index for pFKey */
    SrcList *pSrc;
    int *aiCol = 0;

    if( aChange && fkParentIsModified(pTab, pFKey, aChange, bChngRowid)==0 ){
      continue;
    }

    if( !pFKey->isDeferred && !(db->flags & SQLITE_DeferFKs) 
     && !pParse->pToplevel && !pParse->isMultiWrite 
    ){
      assert( regOld==0 && regNew!=0 );
      /* Inserting a single row into a parent table cannot cause (or fix)
      ** an immediate foreign key violation. So do nothing in this case.  */
      continue;
    }

    if( sqlite3FkLocateIndex(pParse, pTab, pFKey, &pIdx, &aiCol) ){
      if( !isIgnoreErrors || db->mallocFailed ) return;
      continue;
    }
    assert( aiCol || pFKey->nCol==1 );

    /* Create a SrcList structure containing the child table.  We need the
    ** child table as a SrcList for sqlite3WhereBegin() */
    pSrc = sqlite3SrcListAppend(db, 0, 0, 0);
    if( pSrc ){
      struct SrcList_item *pItem = pSrc->a;
      pItem->pTab = pFKey->pFrom;
      pItem->zName = pFKey->pFrom->zName;
      pItem->pTab->nTabRef++;
      pItem->iCursor = pParse->nTab++;
  
      if( regNew!=0 ){
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regNew, -1);
      }
      if( regOld!=0 ){
        int eAction = pFKey->aAction[aChange!=0];
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regOld, 1);
        /* If this is a deferred FK constraint, or a CASCADE or SET NULL
        ** action applies, then any foreign key violations caused by
        ** removing the parent key will be rectified by the action trigger.
        ** So do not set the "may-abort" flag in this case.
        **
        ** Note 1: If the FK is declared "ON UPDATE CASCADE", then the
        ** may-abort flag will eventually be set on this statement anyway
        ** (when this function is called as part of processing the UPDATE
        ** within the action trigger).
        **
        ** Note 2: At first glance it may seem like SQLite could simply omit
        ** all OP_FkCounter related scans when either CASCADE or SET NULL
        ** applies. The trouble starts if the CASCADE or SET NULL action 
        ** trigger causes other triggers or action rules attached to the 
        ** child table to fire. In these cases the fk constraint counters
        ** might be set incorrectly if any OP_FkCounter related scans are 
        ** omitted.  */
        if( !pFKey->isDeferred && eAction!=OE_Cascade && eAction!=OE_SetNull ){
          sqlite3MayAbort(pParse);
        }
      }
      pItem->zName = 0;
      sqlite3SrcListDelete(db, pSrc);
    }
    sqlite3DbFree(db, aiCol);
  }
}